

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::processInputSource
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
          shared_ptr<InputSource> *is,char *password,bool used_for_input)

{
  function<void_(QPDF_*,_const_char_*)> local_90;
  undefined1 local_70 [8];
  type fn;
  undefined1 local_40 [8];
  _Mem_fn<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*)> f1;
  bool used_for_input_local;
  char *password_local;
  shared_ptr<InputSource> *is_local;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf_local;
  QPDFJob *this_local;
  
  fn._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
  super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QPDF::processInputSource;
  f1.super__Mem_fn_base<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*),_true>._15_1_ =
       used_for_input;
  local_40 = (undefined1  [8])
             std::mem_fn<void(std::shared_ptr<InputSource>,char_const*),QPDF>
                       ((_Mem_fn<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*)> *)
                        QPDF::processInputSource,0);
  std::
  bind<std::_Mem_fn<void(QPDF::*)(std::shared_ptr<InputSource>,char_const*)>&,std::_Placeholder<1>const&,std::shared_ptr<InputSource>&,std::_Placeholder<2>const&>
            ((type *)local_70,
             (_Mem_fn<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*)> *)local_40,
             (_Placeholder<1> *)&std::placeholders::_1,is,(_Placeholder<2> *)&std::placeholders::_2)
  ;
  std::function<void(QPDF*,char_const*)>::
  function<std::_Bind<std::_Mem_fn<void(QPDF::*)(std::shared_ptr<InputSource>,char_const*)>(std::_Placeholder<1>,std::shared_ptr<InputSource>,std::_Placeholder<2>)>&,void>
            ((function<void(QPDF*,char_const*)> *)&local_90,(type *)local_70);
  doProcess(this,pdf,&local_90,password,false,
            (bool)(f1.
                   super__Mem_fn_base<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*),_true>
                   ._15_1_ & 1),false);
  std::function<void_(QPDF_*,_const_char_*)>::~function(&local_90);
  std::
  _Bind<std::_Mem_fn<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*)>_(std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>)>
  ::~_Bind((_Bind<std::_Mem_fn<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*)>_(std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>)>
            *)local_70);
  return;
}

Assistant:

void
QPDFJob::processInputSource(
    std::unique_ptr<QPDF>& pdf,
    std::shared_ptr<InputSource> is,
    char const* password,
    bool used_for_input)
{
    auto f1 = std::mem_fn(&QPDF::processInputSource);
    auto fn = std::bind(f1, std::placeholders::_1, is, std::placeholders::_2);
    doProcess(pdf, fn, password, false, used_for_input, false);
}